

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpagelayout.cpp
# Opt level: O0

qreal qt_pointMultiplier(Unit unit)

{
  Unit unit_local;
  qreal local_8;
  
  switch(unit) {
  case Millimeter:
    local_8 = 2.83464566929;
    break;
  case Point:
    local_8 = 1.0;
    break;
  case Inch:
    local_8 = 72.0;
    break;
  case Pica:
    local_8 = 12.0;
    break;
  case Didot:
    local_8 = 1.065826771;
    break;
  case Cicero:
    local_8 = 12.789921252;
    break;
  default:
    local_8 = 1.0;
  }
  return local_8;
}

Assistant:

Q_GUI_EXPORT qreal qt_pointMultiplier(QPageLayout::Unit unit)
{
    switch (unit) {
    case QPageLayout::Millimeter:
        return 2.83464566929;
    case QPageLayout::Point:
        return 1.0;
    case QPageLayout::Inch:
        return 72.0;
    case QPageLayout::Pica:
        return 12;
    case QPageLayout::Didot:
        return 1.065826771;
    case QPageLayout::Cicero:
        return 12.789921252;
    }
    return 1.0;
}